

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  byte in;
  _Bool _Var1;
  size_t sVar2;
  char *ptr;
  long lVar3;
  size_t sVar4;
  ulong local_48;
  size_t local_40;
  
  if (-1 < inlength) {
    if (inlength == 0) {
      sVar2 = strlen(string);
    }
    else {
      sVar2 = (size_t)(uint)inlength;
    }
    local_48 = sVar2 + 1;
    ptr = (char *)(*Curl_cmalloc)(local_48);
    if (ptr != (char *)0x0) {
      sVar4 = 0;
      lVar3 = 0;
      local_40 = local_48;
      do {
        if (sVar2 == sVar4) {
          ptr[lVar3] = '\0';
          return ptr;
        }
        in = string[sVar4];
        _Var1 = Curl_isunreserved(in);
        if (_Var1) {
          ptr[lVar3] = in;
          lVar3 = lVar3 + 1;
        }
        else {
          local_40 = local_40 + 2;
          if (local_48 < local_40) {
            local_48 = local_48 * 2;
            ptr = (char *)Curl_saferealloc(ptr,local_48);
            if (ptr == (char *)0x0) {
              return (char *)0x0;
            }
          }
          curl_msnprintf(ptr + lVar3,4,"%%%02X",(ulong)in);
          lVar3 = lVar3 + 3;
        }
        sVar4 = sVar4 + 1;
      } while( true );
    }
  }
  return (char *)0x0;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t alloc;
  char *ns;
  char *testing_ptr = NULL;
  size_t newlen;
  size_t strindex = 0;
  size_t length;
  CURLcode result;

  if(inlength < 0)
    return NULL;

  alloc = (inlength?(size_t)inlength:strlen(string)) + 1;
  newlen = alloc;

  ns = malloc(alloc);
  if(!ns)
    return NULL;

  length = alloc-1;
  while(length--) {
    unsigned char in = *string; /* we need to treat the characters unsigned */

    if(Curl_isunreserved(in))
      /* just copy this */
      ns[strindex++] = in;
    else {
      /* encode it */
      newlen += 2; /* the size grows with two, since this'll become a %XX */
      if(newlen > alloc) {
        alloc *= 2;
        testing_ptr = Curl_saferealloc(ns, alloc);
        if(!testing_ptr)
          return NULL;
        ns = testing_ptr;
      }

      result = Curl_convert_to_network(data, (char *)&in, 1);
      if(result) {
        /* Curl_convert_to_network calls failf if unsuccessful */
        free(ns);
        return NULL;
      }

      msnprintf(&ns[strindex], 4, "%%%02X", in);

      strindex += 3;
    }
    string++;
  }
  ns[strindex] = 0; /* terminate it */
  return ns;
}